

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall asmjit::ZoneHeap::reset(ZoneHeap *this,Zone *zone)

{
  void *pvVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  DynamicBlock *next;
  DynamicBlock *block;
  void *local_20;
  
  local_20 = (void *)in_RDI[0xb];
  while (local_20 != (void *)0x0) {
    pvVar1 = *(void **)((long)local_20 + 8);
    free(local_20);
    local_20 = pvVar1;
  }
  memset(in_RDI,0,0x60);
  *in_RDI = in_RSI;
  return;
}

Assistant:

void ZoneHeap::reset(Zone* zone) noexcept {
  // Free dynamic blocks.
  DynamicBlock* block = _dynamicBlocks;
  while (block) {
    DynamicBlock* next = block->next;
    Internal::releaseMemory(block);
    block = next;
  }

  // Zero the entire class and initialize to the given `zone`.
  ::memset(this, 0, sizeof(*this));
  _zone = zone;
}